

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_32_pi_di(void)

{
  uint value;
  uint addr_in;
  ulong uVar1;
  
  value = OPER_AY_DI_32();
  uVar1 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  addr_in = *(uint *)((long)m68ki_cpu.dar + uVar1 + 0x20);
  *(uint *)((long)m68ki_cpu.dar + uVar1 + 0x20) = addr_in + 4;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_32(addr_in & m68ki_cpu.address_mask,value);
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_32_pi_di(void)
{
	uint res = OPER_AY_DI_32();
	uint ea = EA_AX_PI_32();

	m68ki_write_32(ea, res);

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}